

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txmempool.cpp
# Opt level: O2

void __thiscall
CTxMemPool::removeForReorg
          (CTxMemPool *this,CChain *chain,
          function<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>)>
          check_final_and_mature)

{
  _Rb_tree_header *p_Var1;
  long lVar2;
  pointer phVar3;
  bool bVar4;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *phVar5;
  CTxMemPool *pCVar6;
  hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
  *phVar7;
  pointer phVar8;
  CTxMemPool *in_RDX;
  long *plVar9;
  CTxMemPool *this_00;
  CTxMemPool *pCVar10;
  long in_FS_OFFSET;
  setEntries setAllRemoves;
  setEntries txToRemove;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var1 = &txToRemove._M_t._M_impl.super__Rb_tree_header;
  txToRemove._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  txToRemove._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  txToRemove._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  phVar5 = (this->mapTx).
           super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
           .member;
  phVar3 = ((phVar5->
            super_hashed_index_node_trampoline<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
            ).super_hashed_index_node_impl<std::allocator<char>_>.next_)->prior_;
  setAllRemoves._M_t._M_impl._0_8_ = &phVar3[-0x17].next_;
  if (phVar3 == (pointer)0x0) {
    setAllRemoves._M_t._M_impl._0_8_ =
         (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
          *)0x0;
  }
  this_00 = this;
  txToRemove._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  txToRemove._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  while ((hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
          *)setAllRemoves._M_t._M_impl._0_8_ != phVar5) {
    this_00 = in_RDX;
    bVar4 = std::
            function<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>)>
            ::operator()((function<bool_(boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>)>
                          *)in_RDX,
                         (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                          )setAllRemoves._M_t._M_impl._0_8_);
    if (bVar4) {
      this_00 = (CTxMemPool *)&txToRemove;
      std::
      _Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<...lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
      ::
      _M_insert_unique<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>const&>
                ((_Rb_tree<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<___lti_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>
                  *)&txToRemove,
                 (hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>,_boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>_>,_boost::multi_index::detail::hashed_unique_tag,_boost::multi_index::detail::hashed_index_global_iterator_tag>
                  *)&setAllRemoves);
    }
    plVar9 = (long *)**(long **)(setAllRemoves._M_t._M_impl._0_8_ + 0x170);
    if (plVar9 == (long *)(setAllRemoves._M_t._M_impl._0_8_ + 0x168)) {
      plVar9 = *(long **)(setAllRemoves._M_t._M_impl._0_8_ + 0x170);
    }
    setAllRemoves._M_t._M_impl._0_8_ = plVar9 + -0x2d;
    if (plVar9 == (long *)0x0) {
      setAllRemoves._M_t._M_impl._0_8_ =
           (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
            *)0x0;
    }
    phVar5 = (this->mapTx).
             super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
             .member;
  }
  setAllRemoves._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &setAllRemoves._M_t._M_impl.super__Rb_tree_header._M_header;
  setAllRemoves._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  setAllRemoves._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  setAllRemoves._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pCVar10 = (CTxMemPool *)txToRemove._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  setAllRemoves._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       setAllRemoves._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while (pCVar10 != (CTxMemPool *)p_Var1) {
    CalculateDescendants
              (this_00,(hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                        *)pCVar10->lastRollingFeeUpdate,&setAllRemoves);
    pCVar6 = (CTxMemPool *)std::_Rb_tree_increment((_Rb_tree_node_base *)pCVar10);
    this_00 = pCVar10;
    pCVar10 = pCVar6;
  }
  RemoveStaged(this,&setAllRemoves,false,REORG);
  phVar7 = (this->mapTx).
           super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
           .member;
  phVar3 = ((phVar7->
            super_hashed_index_node_trampoline<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
            ).super_hashed_index_node_impl<std::allocator<char>_>.next_)->prior_;
  phVar5 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
            *)&phVar3[-0x17].next_;
  if (phVar3 == (pointer)0x0) {
    phVar5 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
              *)0x0;
  }
  while( true ) {
    if (phVar5 == phVar7) {
      std::_Rb_tree<$270907ca$>::~_Rb_tree(&setAllRemoves._M_t);
      std::_Rb_tree<$270907ca$>::~_Rb_tree(&txToRemove._M_t);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        return;
      }
      __stack_chk_fail();
    }
    bVar4 = TestLockPointValidity
                      (chain,(LockPoints *)
                             ((long)&(phVar5->
                                     super_hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>
                                     ).
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>
                                     .
                                     super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>
                                     .
                                     super_index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>
                                     .super_pod_value_holder<CTxMemPoolEntry>.space + 0xb0));
    if (!bVar4) break;
    phVar3 = (pointer)(phVar5->
                      super_hashed_index_node_trampoline<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                      ).super_hashed_index_node_impl<std::allocator<char>_>.next_;
    phVar8 = (phVar3->super_hashed_index_base_node_impl<std::allocator<char>_>).prior_;
    if (phVar8 == &(phVar5->
                   super_hashed_index_node_trampoline<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                   ).super_hashed_index_node_impl<std::allocator<char>_>) {
      phVar8 = phVar3;
    }
    phVar5 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
              *)&phVar8[-0x17].next_;
    if (phVar8 == (pointer)0x0) {
      phVar5 = (hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>
                *)0x0;
    }
    phVar7 = (this->mapTx).
             super_header_holder<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<CTxMemPoolEntry,_std::allocator<CTxMemPoolEntry>_>_>_>_>_>_>_*,_boost::multi_index::multi_index_container<CTxMemPoolEntry,_CTxMemPool::CTxMemPoolEntry_Indices,_std::allocator<CTxMemPoolEntry>_>_>
             .member;
  }
  __assert_fail("TestLockPointValidity(chain, it->GetLockPoints())",
                "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/txmempool.cpp"
                ,0x260,"void CTxMemPool::removeForReorg(CChain &, std::function<bool (txiter)>)");
}

Assistant:

void CTxMemPool::removeForReorg(CChain& chain, std::function<bool(txiter)> check_final_and_mature)
{
    // Remove transactions spending a coinbase which are now immature and no-longer-final transactions
    AssertLockHeld(cs);
    AssertLockHeld(::cs_main);

    setEntries txToRemove;
    for (indexed_transaction_set::const_iterator it = mapTx.begin(); it != mapTx.end(); it++) {
        if (check_final_and_mature(it)) txToRemove.insert(it);
    }
    setEntries setAllRemoves;
    for (txiter it : txToRemove) {
        CalculateDescendants(it, setAllRemoves);
    }
    RemoveStaged(setAllRemoves, false, MemPoolRemovalReason::REORG);
    for (indexed_transaction_set::const_iterator it = mapTx.begin(); it != mapTx.end(); it++) {
        assert(TestLockPointValidity(chain, it->GetLockPoints()));
    }
}